

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

void SZIP_closeArchive(void *opaque)

{
  ISzAlloc *in_RSI;
  
  if (opaque != (void *)0x0) {
    if (*(long *)((long)opaque + 0x20) != 0) {
      (**(code **)(*(long *)((long)opaque + 0x20) + 0x48))();
    }
    SzArEx_Free((CSzArEx *)((long)opaque + 0x28),in_RSI);
    __PHYSFS_DirTreeDeinit((__PHYSFS_DirTree *)opaque);
    (*__PHYSFS_AllocatorHooks.Free)(opaque);
    return;
  }
  return;
}

Assistant:

static void SZIP_closeArchive(void *opaque)
{
    SZIPinfo *info = (SZIPinfo *) opaque;
    if (info)
    {
        if (info->io)
            info->io->destroy(info->io);
        SzArEx_Free(&info->db, &SZIP_SzAlloc);
        __PHYSFS_DirTreeDeinit(&info->tree);
        allocator.Free(info);
    } /* if */
}